

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O2

void notifyCurl(CURLM *curl,curl_socket_t s,int evBitmask,char *info)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  int numhandles;
  
  iVar2 = curl_multi_socket_action
                    (curl,CONCAT44(in_register_00000034,s),CONCAT44(in_register_00000014,evBitmask))
  ;
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_multi_strerror(iVar2);
    curl_mfprintf(uVar1,"Curl error on %s: %i (%s)\n",info,iVar2,uVar3);
  }
  return;
}

Assistant:

static void notifyCurl(CURLM *curl, curl_socket_t s, int evBitmask,
                       const char *info)
{
  int numhandles = 0;
  CURLMcode result = curl_multi_socket_action(curl, s, evBitmask, &numhandles);
  if(result != CURLM_OK) {
    fprintf(stderr, "Curl error on %s: %i (%s)\n",
            info, result, curl_multi_strerror(result));
  }
}